

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

string * absl::(anonymous_namespace)::CEscapeInternal_abi_cxx11_
                   (string_view src,bool use_hex,bool utf8_safe)

{
  byte c_00;
  bool bVar1;
  bool bVar2;
  byte *pbVar3;
  byte in_CL;
  char cVar4;
  string *in_RDI;
  byte in_R8B;
  uchar uc;
  bool is_hex_escape;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  bool last_hex_escape;
  string *dest;
  bool local_3a;
  byte *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  std::__cxx11::string::string((string *)in_RDI);
  local_3a = false;
  local_30 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_18);
  pbVar3 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::end(&local_18);
  for (; local_30 != pbVar3; local_30 = local_30 + 1) {
    c_00 = *local_30;
    bVar1 = false;
    if (c_00 == 9) {
      std::__cxx11::string::append((char *)in_RDI);
      local_3a = bVar1;
    }
    else if (c_00 == 10) {
      std::__cxx11::string::append((char *)in_RDI);
      local_3a = bVar1;
    }
    else if (c_00 == 0xd) {
      std::__cxx11::string::append((char *)in_RDI);
      local_3a = bVar1;
    }
    else if (c_00 == 0x22) {
      std::__cxx11::string::append((char *)in_RDI);
      local_3a = bVar1;
    }
    else if (c_00 == 0x27) {
      std::__cxx11::string::append((char *)in_RDI);
      local_3a = bVar1;
    }
    else if (c_00 == 0x5c) {
      std::__cxx11::string::append((char *)in_RDI);
      local_3a = bVar1;
    }
    else {
      cVar4 = (char)in_RDI;
      if ((((in_R8B & 1) != 0) && (0x7f < c_00)) ||
         ((bVar2 = ascii_isprint(c_00), bVar2 &&
          ((!local_3a || (bVar2 = ascii_isxdigit(c_00), !bVar2)))))) {
        std::__cxx11::string::push_back(cVar4);
        local_3a = bVar1;
      }
      else {
        local_3a = (in_CL & 1) == 0;
        if (local_3a) {
          std::__cxx11::string::append((char *)in_RDI);
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::push_back(cVar4);
        }
        else {
          std::__cxx11::string::append((char *)in_RDI);
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::push_back(cVar4);
        }
        local_3a = !local_3a;
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string CEscapeInternal(absl::string_view src, bool use_hex,
                            bool utf8_safe) {
  std::string dest;
  bool last_hex_escape = false;  // true if last output char was \xNN.

  for (char c : src) {
    bool is_hex_escape = false;
    switch (c) {
      case '\n': dest.append("\\" "n"); break;
      case '\r': dest.append("\\" "r"); break;
      case '\t': dest.append("\\" "t"); break;
      case '\"': dest.append("\\" "\""); break;
      case '\'': dest.append("\\" "'"); break;
      case '\\': dest.append("\\" "\\"); break;
      default: {
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        const unsigned char uc = static_cast<unsigned char>(c);
        if ((!utf8_safe || uc < 0x80) &&
            (!absl::ascii_isprint(uc) ||
             (last_hex_escape && absl::ascii_isxdigit(uc)))) {
          if (use_hex) {
            dest.append("\\" "x");
            dest.push_back(numbers_internal::kHexChar[uc / 16]);
            dest.push_back(numbers_internal::kHexChar[uc % 16]);
            is_hex_escape = true;
          } else {
            dest.append("\\");
            dest.push_back(numbers_internal::kHexChar[uc / 64]);
            dest.push_back(numbers_internal::kHexChar[(uc % 64) / 8]);
            dest.push_back(numbers_internal::kHexChar[uc % 8]);
          }
        } else {
          dest.push_back(c);
          break;
        }
      }
    }
    last_hex_escape = is_hex_escape;
  }

  return dest;
}